

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

int __thiscall
FIX::DataDictionary::lookupXMLFieldNumber(DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  ConfigError *this_00;
  string *pDoc_00;
  DOMAttributesPtr attrs;
  string name;
  long *local_70;
  string local_68;
  string local_48;
  
  (*pNode->_vptr_DOMNode[4])(&local_70,pNode);
  plVar2 = local_70;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
  pDoc_00 = &local_68;
  cVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,pDoc_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    pDoc_00 = (string *)(local_68.field_2._M_allocated_capacity + 1);
    operator_delete(local_68._M_dataplus._M_p,(ulong)pDoc_00);
  }
  if (cVar3 != '\0') {
    iVar4 = lookupXMLFieldNumber(this,(DOMDocument *)pDoc_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    return iVar4;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"No name given to field","");
  ConfigError::ConfigError(this_00,&local_68);
  __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

int DataDictionary::lookupXMLFieldNumber(DOMDocument *pDoc, DOMNode *pNode) const {
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to field");
  }
  return lookupXMLFieldNumber(pDoc, name);
}